

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::ReferenceContext::framebufferTexture2D
          (ReferenceContext *this,deUint32 target,deUint32 attachment,deUint32 textarget,
          deUint32 texture,int level)

{
  Framebuffer *pFVar1;
  Framebuffer *pFVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  Texture *pTVar6;
  TestError *this_00;
  Framebuffer **ppFVar7;
  TexTarget TVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  Attachment *attachment_00;
  bool bVar12;
  
  if ((int)attachment < 0x8d00) {
    if (attachment == 0x821a) {
      (*(this->super_Context)._vptr_Context[0x1e])
                (this,(ulong)target,0x8d00,(ulong)textarget,(ulong)texture,level);
      (*(this->super_Context)._vptr_Context[0x1e])
                (this,(ulong)target,0x8d20,(ulong)textarget,(ulong)texture,level);
      return;
    }
    if (attachment == 0x8ce0) {
      bVar12 = false;
      lVar10 = 0;
    }
    else {
LAB_004e4370:
      lVar10 = 3;
      bVar12 = true;
    }
  }
  else {
    if (attachment == 0x8d00) {
      lVar10 = 1;
    }
    else {
      if (attachment != 0x8d20) goto LAB_004e4370;
      lVar10 = 2;
    }
    bVar12 = false;
  }
  switch(textarget) {
  case 0x8515:
    bVar5 = 1;
    bVar3 = false;
    bVar4 = 1;
    TVar8 = TEXTARGET_CUBE_MAP_POSITIVE_X;
    goto LAB_004e4456;
  case 0x8516:
    TVar8 = TEXTARGET_CUBE_MAP_NEGATIVE_X;
    break;
  case 0x8517:
    TVar8 = TEXTARGET_CUBE_MAP_POSITIVE_Y;
    break;
  case 0x8518:
    TVar8 = TEXTARGET_CUBE_MAP_NEGATIVE_Y;
    break;
  case 0x8519:
    TVar8 = TEXTARGET_CUBE_MAP_POSITIVE_Z;
    break;
  case 0x851a:
    TVar8 = TEXTARGET_CUBE_MAP_NEGATIVE_Z;
    break;
  default:
    if (textarget == 0xde1) {
      bVar3 = true;
      bVar4 = 1;
      bVar5 = 0;
      TVar8 = TEXTARGET_2D;
    }
    else {
      TVar8 = TEXTARGET_LAST;
      bVar4 = 0;
      bVar5 = 1;
      bVar3 = false;
    }
    goto LAB_004e4456;
  }
  bVar5 = 1;
  bVar3 = false;
  bVar4 = 1;
LAB_004e4456:
  if (((1 < target - 0x8ca8) && (target != 0x8d40)) || (bVar12)) {
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x500;
    return;
  }
  ppFVar7 = &this->m_readFramebufferBinding;
  if (target == 0x8ca9) {
    ppFVar7 = &this->m_drawFramebufferBinding;
  }
  if (target == 0x8d40) {
    ppFVar7 = &this->m_drawFramebufferBinding;
  }
  pFVar1 = *ppFVar7;
  if (pFVar1 != (Framebuffer *)0x0) {
    pFVar2 = this->m_drawFramebufferBinding;
    bVar12 = pFVar1 == this->m_readFramebufferBinding;
    if (texture == 0) {
      pTVar6 = (Texture *)0x0;
      goto LAB_004e4533;
    }
    pTVar6 = rc::ObjectManager<sglr::rc::Texture>::find(&this->m_textures,texture);
    if (pTVar6 != (Texture *)0x0) {
      if (level != 0) {
        if (this->m_lastError != 0) {
          return;
        }
        this->m_lastError = 0x501;
        return;
      }
      if (pTVar6->m_type == TYPE_CUBE_MAP) {
        if ((bool)(bVar5 & bVar4)) goto LAB_004e4533;
      }
      else {
        if (pTVar6->m_type != TYPE_2D) {
          this_00 = (TestError *)__cxa_allocate_exception(0x38,lVar10,bVar12,0);
          tcu::TestError::TestError
                    (this_00,(char *)0x0,"texObj->getType() == Texture::TYPE_CUBE_MAP",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                     ,0x7d7);
          __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        if (bVar3) {
LAB_004e4533:
          attachment_00 = pFVar1->m_attachments + lVar10;
          iVar9 = (uint)bVar12 + (uint)(pFVar1 == pFVar2);
          for (iVar11 = iVar9; iVar11 != 0; iVar11 = iVar11 + -1) {
            releaseFboAttachmentReference(this,attachment_00);
          }
          attachment_00->type = ATTACHMENTTYPE_LAST;
          attachment_00->name = 0;
          pFVar1->m_attachments[lVar10].texTarget = TEXTARGET_LAST;
          pFVar1->m_attachments[lVar10].level = 0;
          pFVar1->m_attachments[lVar10].layer = 0;
          if (pTVar6 == (Texture *)0x0) {
            return;
          }
          attachment_00->type = ATTACHMENTTYPE_TEXTURE;
          pFVar1->m_attachments[lVar10].name = (pTVar6->super_NamedObject).m_name;
          pFVar1->m_attachments[lVar10].texTarget = TVar8;
          pFVar1->m_attachments[lVar10].level = level;
          for (; iVar9 != 0; iVar9 = iVar9 + -1) {
            acquireFboAttachmentReference(this,attachment_00);
          }
          return;
        }
      }
    }
  }
  if (this->m_lastError == 0) {
    this->m_lastError = 0x502;
  }
  return;
}

Assistant:

void ReferenceContext::framebufferTexture2D (deUint32 target, deUint32 attachment, deUint32 textarget, deUint32 texture, int level)
{
	if (attachment == GL_DEPTH_STENCIL_ATTACHMENT)
	{
		// Attach to both depth and stencil.
		framebufferTexture2D(target, GL_DEPTH_ATTACHMENT,	textarget, texture, level);
		framebufferTexture2D(target, GL_STENCIL_ATTACHMENT,	textarget, texture, level);
	}
	else
	{
		Framebuffer::AttachmentPoint	point			= mapGLAttachmentPoint(attachment);
		Texture*						texObj			= DE_NULL;
		Framebuffer::TexTarget			fboTexTarget	= mapGLFboTexTarget(textarget);

		RC_IF_ERROR(target != GL_FRAMEBUFFER		&&
					target != GL_DRAW_FRAMEBUFFER	&&
					target != GL_READ_FRAMEBUFFER,				GL_INVALID_ENUM,		RC_RET_VOID);
		RC_IF_ERROR(point == Framebuffer::ATTACHMENTPOINT_LAST,	GL_INVALID_ENUM,		RC_RET_VOID);

		// Select binding point.
		rc::Framebuffer* framebufferBinding = (target == GL_FRAMEBUFFER || target == GL_DRAW_FRAMEBUFFER) ? m_drawFramebufferBinding : m_readFramebufferBinding;
		RC_IF_ERROR(!framebufferBinding, GL_INVALID_OPERATION, RC_RET_VOID);

		// If framebuffer object is bound for both reading and writing then we need to acquire/release multiple references.
		int bindingRefCount = (framebufferBinding == m_drawFramebufferBinding ? 1 : 0)
							+ (framebufferBinding == m_readFramebufferBinding ? 1 : 0);

		if (texture != 0)
		{
			texObj = m_textures.find(texture);

			RC_IF_ERROR(!texObj,		GL_INVALID_OPERATION,	RC_RET_VOID);
			RC_IF_ERROR(level != 0,		GL_INVALID_VALUE,		RC_RET_VOID); // \todo [2012-03-19 pyry] We should allow other levels as well.

			if (texObj->getType() == Texture::TYPE_2D)
				RC_IF_ERROR(fboTexTarget != Framebuffer::TEXTARGET_2D, GL_INVALID_OPERATION, RC_RET_VOID);
			else
			{
				TCU_CHECK(texObj->getType() == Texture::TYPE_CUBE_MAP);
				if (!deInRange32(fboTexTarget, Framebuffer::TEXTARGET_CUBE_MAP_POSITIVE_X, Framebuffer::TEXTARGET_CUBE_MAP_NEGATIVE_Z))
					RC_ERROR_RET(GL_INVALID_OPERATION, RC_RET_VOID);
			}
		}

		Framebuffer::Attachment& fboAttachment = framebufferBinding->getAttachment(point);
		for (int ndx = 0; ndx < bindingRefCount; ndx++)
			releaseFboAttachmentReference(fboAttachment);
		fboAttachment = Framebuffer::Attachment();

		if (texObj)
		{
			fboAttachment.type			= Framebuffer::ATTACHMENTTYPE_TEXTURE;
			fboAttachment.name			= texObj->getName();
			fboAttachment.texTarget		= fboTexTarget;
			fboAttachment.level			= level;

			for (int ndx = 0; ndx < bindingRefCount; ndx++)
				acquireFboAttachmentReference(fboAttachment);
		}
	}
}